

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUtils.h
# Opt level: O1

void generalSolveTest1(int dim,int dl)

{
  CSR *pCVar1;
  CSC *pCVar2;
  iterator iVar3;
  Matrix *pMVar4;
  Matrix *this;
  TriangularSolve *pTVar5;
  long lVar6;
  Matrix *pMVar7;
  long lVar8;
  ulong uVar9;
  ostream *poVar10;
  diagonal *pdVar11;
  Matrix *this_00;
  int iVar12;
  double *pdVar13;
  double durationSym1;
  vector<double,_std::allocator<double>_> t4;
  vector<double,_std::allocator<double>_> t3;
  vector<double,_std::allocator<double>_> t2;
  vector<double,_std::allocator<double>_> t1;
  double local_140;
  Matrix *local_138;
  Matrix *local_130;
  CSR *local_128;
  CSC *local_120;
  double *local_118;
  iterator iStack_110;
  double *local_108;
  double *local_f8;
  iterator iStack_f0;
  double *local_e8;
  double *local_d8;
  iterator iStack_d0;
  double *local_c8;
  double *local_b8;
  iterator iStack_b0;
  double *local_a8;
  TriangularSolve *local_a0;
  diagonal *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_138 = (Matrix *)CONCAT44(local_138._4_4_,dl);
  local_b8 = (double *)0x0;
  iStack_b0._M_current = (double *)0x0;
  local_a8 = (double *)0x0;
  local_c8 = (double *)0x0;
  local_d8 = (double *)0x0;
  iStack_d0._M_current = (double *)0x0;
  local_e8 = (double *)0x0;
  local_f8 = (double *)0x0;
  iStack_f0._M_current = (double *)0x0;
  local_108 = (double *)0x0;
  local_118 = (double *)0x0;
  iStack_110._M_current = (double *)0x0;
  pMVar4 = (Matrix *)operator_new(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50," ","");
  Matrix::Matrix(pMVar4,dim,dim,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"diagonal","");
  Matrix::Random(pMVar4,(int)local_138,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  Matrix::LowerTriangular(pMVar4);
  this = (Matrix *)operator_new(0x30);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"rhs","");
  Matrix::Matrix(this,dim,1,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  Matrix::Random(this);
  pTVar5 = (TriangularSolve *)operator_new(4);
  TriangularSolve::TriangularSolve(pTVar5,dim);
  local_128 = (CSR *)operator_new(0x30);
  CSR::CSR(local_128,pMVar4);
  local_a0 = (TriangularSolve *)operator_new(4);
  local_130 = (Matrix *)CONCAT44(local_130._4_4_,dim);
  TriangularSolve::TriangularSolve(local_a0,dim);
  iVar12 = 5;
  do {
    lVar6 = std::chrono::_V2::system_clock::now();
    pMVar7 = TriangularSolve::solve(pTVar5,local_128,this);
    lVar8 = std::chrono::_V2::system_clock::now();
    local_140 = (double)(lVar8 - lVar6) / 1000000000.0;
    if (iStack_b0._M_current == local_a8) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_b8,iStack_b0,&local_140);
    }
    else {
      *iStack_b0._M_current = local_140;
      iStack_b0._M_current = iStack_b0._M_current + 1;
    }
    if (pMVar7 != (Matrix *)0x0) {
      Matrix::~Matrix(pMVar7);
      operator_delete(pMVar7,0x30);
    }
    iVar3._M_current = iStack_b0._M_current;
    pdVar13 = local_b8;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  if (local_b8 != iStack_b0._M_current) {
    uVar9 = (long)iStack_b0._M_current - (long)local_b8 >> 3;
    lVar6 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_b8,iStack_b0._M_current,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar13,iVar3._M_current);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"solve(CSR)",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
  iVar3._M_current = iStack_b0._M_current;
  for (pdVar13 = local_b8; pdVar13 != iVar3._M_current; pdVar13 = pdVar13 + 1) {
    poVar10 = std::ostream::_M_insert<double>(*pdVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  iVar12 = CSR::turntoCSC(local_128);
  local_120 = (CSC *)operator_new(0x30);
  CSC::CSC(local_120,(int)local_130,(int)local_130,iVar12,local_128->ptr,local_128->idx,
           local_128->val);
  iVar12 = 5;
  do {
    lVar6 = std::chrono::_V2::system_clock::now();
    pMVar7 = TriangularSolve::solve(pTVar5,local_120,this);
    lVar8 = std::chrono::_V2::system_clock::now();
    local_140 = (double)(lVar8 - lVar6) / 1000000000.0;
    if (iStack_d0._M_current == local_c8) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_d8,iStack_d0,&local_140);
    }
    else {
      *iStack_d0._M_current = local_140;
      iStack_d0._M_current = iStack_d0._M_current + 1;
    }
    if (pMVar7 != (Matrix *)0x0) {
      Matrix::~Matrix(pMVar7);
      operator_delete(pMVar7,0x30);
    }
    iVar3._M_current = iStack_d0._M_current;
    pdVar13 = local_d8;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  if (local_d8 != iStack_d0._M_current) {
    uVar9 = (long)iStack_d0._M_current - (long)local_d8 >> 3;
    lVar6 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_d8,iStack_d0._M_current,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar13,iVar3._M_current);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"solve(CSC)",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
  iVar3._M_current = iStack_d0._M_current;
  for (pdVar13 = local_d8; pdVar13 != iVar3._M_current; pdVar13 = pdVar13 + 1) {
    poVar10 = std::ostream::_M_insert<double>(*pdVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  pdVar11 = (diagonal *)operator_new(0x18);
  diagonal::diagonal(pdVar11,(int)local_130,(int)local_130,(int)local_138);
  local_130 = diagonal::diaStore(pdVar11,pMVar4,1);
  diagonal::offsetCompute(pdVar11,1);
  iVar12 = 5;
  do {
    lVar6 = std::chrono::_V2::system_clock::now();
    pMVar7 = TriangularSolve::solved1(pTVar5,local_130,this,(int)local_138);
    lVar8 = std::chrono::_V2::system_clock::now();
    local_140 = (double)(lVar8 - lVar6) / 1000000000.0;
    if (iStack_f0._M_current == local_e8) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_f8,iStack_f0,&local_140);
    }
    else {
      *iStack_f0._M_current = local_140;
      iStack_f0._M_current = iStack_f0._M_current + 1;
    }
    if (pMVar7 != (Matrix *)0x0) {
      Matrix::~Matrix(pMVar7);
      operator_delete(pMVar7,0x30);
    }
    iVar3._M_current = iStack_f0._M_current;
    pdVar13 = local_f8;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  if (local_f8 != iStack_f0._M_current) {
    uVar9 = (long)iStack_f0._M_current - (long)local_f8 >> 3;
    lVar6 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_f8,iStack_f0._M_current,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar13,iVar3._M_current);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"solve(dia1)",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
  iVar3._M_current = iStack_f0._M_current;
  local_98 = pdVar11;
  for (pdVar13 = local_f8; pdVar13 != iVar3._M_current; pdVar13 = pdVar13 + 1) {
    poVar10 = std::ostream::_M_insert<double>(*pdVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  pMVar7 = diagonal::diaStore2(local_98,pMVar4,1);
  iVar12 = 5;
  do {
    lVar6 = std::chrono::_V2::system_clock::now();
    this_00 = TriangularSolve::solve(pTVar5,pMVar7,this,(int)local_138);
    lVar8 = std::chrono::_V2::system_clock::now();
    local_140 = (double)(lVar8 - lVar6) / 1000000000.0;
    if (iStack_110._M_current == local_108) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&local_118,iStack_110,&local_140);
    }
    else {
      *iStack_110._M_current = local_140;
      iStack_110._M_current = iStack_110._M_current + 1;
    }
    if (this_00 != (Matrix *)0x0) {
      Matrix::~Matrix(this_00);
      operator_delete(this_00,0x30);
    }
    iVar3._M_current = iStack_110._M_current;
    pdVar13 = local_118;
    iVar12 = iVar12 + -1;
  } while (iVar12 != 0);
  if (local_118 != iStack_110._M_current) {
    uVar9 = (long)iStack_110._M_current - (long)local_118 >> 3;
    lVar6 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_118,iStack_110._M_current,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar13,iVar3._M_current);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"solve(dia2)",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",",1);
  iVar3._M_current = iStack_110._M_current;
  local_138 = pMVar7;
  for (pdVar13 = local_118; pdVar13 != iVar3._M_current; pdVar13 = pdVar13 + 1) {
    poVar10 = std::ostream::_M_insert<double>(*pdVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  pMVar7 = local_138;
  Matrix::~Matrix(pMVar4);
  operator_delete(pMVar4,0x30);
  Matrix::~Matrix(this);
  operator_delete(this,0x30);
  TriangularSolve::~TriangularSolve(pTVar5);
  operator_delete(pTVar5,4);
  pCVar1 = local_128;
  CSR::~CSR(local_128);
  operator_delete(pCVar1,0x30);
  pTVar5 = local_a0;
  TriangularSolve::~TriangularSolve(local_a0);
  operator_delete(pTVar5,4);
  pCVar2 = local_120;
  CSC::~CSC(local_120);
  operator_delete(pCVar2,0x30);
  pdVar11 = local_98;
  diagonal::~diagonal(local_98);
  operator_delete(pdVar11,0x18);
  pMVar4 = local_130;
  if (local_130 != (Matrix *)0x0) {
    Matrix::~Matrix(local_130);
    operator_delete(pMVar4,0x30);
  }
  if (pMVar7 != (Matrix *)0x0) {
    Matrix::~Matrix(pMVar7);
    operator_delete(pMVar7,0x30);
  }
  if (local_118 != (double *)0x0) {
    operator_delete(local_118,(long)local_108 - (long)local_118);
  }
  if (local_f8 != (double *)0x0) {
    operator_delete(local_f8,(long)local_e8 - (long)local_f8);
  }
  if (local_d8 != (double *)0x0) {
    operator_delete(local_d8,(long)local_c8 - (long)local_d8);
  }
  if (local_b8 != (double *)0x0) {
    operator_delete(local_b8,(long)local_a8 - (long)local_b8);
  }
  return;
}

Assistant:

void generalSolveTest1(int dim, int dl)

{
// 7 for col and row - 4 for diagonal
    vector<double> t1;
    vector<double> t2;
    vector<double> t3;
    vector<double> t4;
    Matrix *dia = new Matrix(dim,dim," ");
    dia->Random(dl,"diagonal");
    dia->LowerTriangular();
    // dia->print();
   // Matrix *v1 = dia->addTest(); // for testing vOne
    //v1->print();
   // Matrix *vOne = new Matrix(dim,1,"v for test"); // for testing with vOne
   // vOne->One();
     Matrix *v1 = new Matrix(dim, 1, "rhs");
     v1->Random();
    // v1->print();

    TriangularSolve *s = new TriangularSolve(dim);

//csrSolve
    CSR *cr1 = new CSR(dia);
    TriangularSolve *rs = new TriangularSolve(dim);//dim:row numbers
    std::chrono::time_point<std::chrono::system_clock> start, end;
    std::chrono::duration<double> elapsed_seconds;
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result1 = s->solve(cr1,v1);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym1 = elapsed_seconds.count();
        // cout << "execution time (CSR Solve):" << durationSym1 << "\n";
        // result1->print();
        t1.push_back(durationSym1);
        delete result1;
    }
    sort(t1.begin(), t1.end());
    cout << "solve(CSR)"<<",";
    for (auto x : t1)
        cout << x << ",";
    cout<<"\n";

    //csr Solve,Test
    // Matrix *rs2 = cr1->csrMult(result1);
    //   rs3->print();
    // bool r1 = rs2->isequal(v1);
    //  cout<<"Testing solve (CSR): "<<r1 <<"\n";

//CSC solve
    int nnz = cr1->turntoCSC();
    CSC *cc1 = new CSC(dim, dim, nnz, cr1->ptr, cr1->idx, cr1->val);

    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result2 = s->solve(cc1,v1);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym2 = elapsed_seconds.count();
        //cout << "execution time (CSC Solve):" << durationSym2 << "\n";
        //result2->print();
        t2.push_back(durationSym2);
        delete result2;
    }
    sort(t2.begin(),t2.end());
    cout << "solve(CSC)"<<",";
    for(auto x:t2)
        cout<<x<<",";
    cout<<"\n";
    //csc Solve,Test
    //Matrix *mcc2 = cc1->cscMult(result2);
    //  mcc2->print();
    // bool r2 = mcc2->isequal(v1);
    //  cout<<"Testing solve (CSC) is: "<<r2 <<"\n";

    //dia1
    diagonal *d1 = new diagonal(dim,dim,dl);
    Matrix *d2 = d1->diaStore(dia,1);//1 for Lower Triangular Matrix
    // d2->print();
    int *f = d1->offsetCompute(1);//1 for Lower Triangular Matrix

    // TriangularSolve *d = new TriangularSolve(100);//n:row number
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result3 = s->solved1(d2,v1,dl);
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym3 = elapsed_seconds.count();
        //cout << "execution time (diagonal1 Solve):" << durationSym3 << "\n";
        // result3->print();
        t3.push_back(durationSym3);
        delete result3;
    }
    sort(t3.begin(), t3.end());
    cout << "solve(dia1)"<<",";
    for(auto x:t3)
        cout<<x<<",";
    cout<<"\n";
    //test
    //Matrix *ts1 = d1->diaMult(d2,result3);
    // bool r3 = ts1->isequal(v1);
    // cout<<"testing solve(dia1): "<<r3<<"\n";

//dia2

    Matrix *d3 = d1->diaStore2(dia,1);
    //d3->print();
    for(int i=0; i<5; i++)
    {
        start = std::chrono::system_clock::now();
        Matrix *result4 = s->solve(d3,v1,dl);//number of diagonals
        end = std::chrono::system_clock::now();
        elapsed_seconds = end - start;
        double durationSym4 = elapsed_seconds.count();
        // cout << "execution time (diagonal2 Solve):" << durationSym4 << "\n";
        // result4->print();
        t4.push_back(durationSym4);
        delete result4;
    }
    sort(t4.begin(), t4.end());
    cout << "solve(dia2)"<<",";
    for(auto x:t4)
        cout<<x<<",";
    cout<<"\n";
    //test
    //Matrix *ts2 = d1->diaMult2(d3,result4);
    // bool r4 = ts2->isequal(v1);
    // cout<<"testing solve(dia2): "<<r4<<"\n";

    //comparing dia1 and dia2 solve
    /* bool r5 = result3->isequal(result4);
     bool r6 = result1->isequal(result2);
     bool r7 = result2->isequal(result3);
     cout<<"dia1&dia2&csr&csc: "<<r5<< ","<< r6 << ","<< r7<<"\n";

     cout<<"test with  vector One:"<<"\n";
     bool r10 = result1->isequal(vOne);
     bool r11 = result2->isequal(vOne);
     bool r12 = result3->isequal(vOne);
     bool r13 = result4->isequal(vOne);
     cout<<"dia1&dia2&csr&csc: "<<r10<< ","<< r11 << ","<< r12<<","<< r13<<"\n";*/

    delete dia;
    delete v1;
    delete s;
    delete cr1;
    delete rs;
    delete cc1;
    delete d1;
    delete d2;
    delete d3;


    // delete rs2;
//    delete cs;
    //  delete result1;
    // delete mcc2;
    //  delete d;
    // delete result3;
    //  delete ts1;
    //  delete result4;
    // delete ts2;

}